

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostkey.c
# Opt level: O2

int hostkey_method_ssh_ecdsa_signv
              (LIBSSH2_SESSION *session,uchar **signature,size_t *signature_len,int veccount,
              iovec *datavec,void **abstract)

{
  EC_KEY *ec_ctx;
  libssh2_curve_type lVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  unsigned_long uStack_90;
  EVP_MD_CTX *ctx;
  size_t *local_80;
  uchar hash [32];
  
  ec_ctx = (EC_KEY *)*abstract;
  lVar1 = _libssh2_ecdsa_get_curve_type(ec_ctx);
  local_80 = signature_len;
  if (lVar1 == LIBSSH2_EC_CURVE_NISTP521) {
    _libssh2_sha512_init(&ctx);
    uVar3 = 0;
    uVar4 = (ulong)(uint)veccount;
    if (veccount < 1) {
      uVar4 = uVar3;
    }
    for (; uVar4 * 0x10 != uVar3; uVar3 = uVar3 + 0x10) {
      EVP_DigestUpdate((EVP_MD_CTX *)ctx,*(void **)((long)&datavec->iov_base + uVar3),
                       *(size_t *)((long)&datavec->iov_len + uVar3));
    }
    EVP_DigestFinal((EVP_MD_CTX *)ctx,hash,(uint *)0x0);
    EVP_MD_CTX_free(ctx);
    uStack_90 = 0x40;
  }
  else if (lVar1 == LIBSSH2_EC_CURVE_NISTP384) {
    _libssh2_sha384_init(&ctx);
    uVar3 = 0;
    uVar4 = (ulong)(uint)veccount;
    if (veccount < 1) {
      uVar4 = uVar3;
    }
    for (; uVar4 * 0x10 != uVar3; uVar3 = uVar3 + 0x10) {
      EVP_DigestUpdate((EVP_MD_CTX *)ctx,*(void **)((long)&datavec->iov_base + uVar3),
                       *(size_t *)((long)&datavec->iov_len + uVar3));
    }
    EVP_DigestFinal((EVP_MD_CTX *)ctx,hash,(uint *)0x0);
    EVP_MD_CTX_free(ctx);
    uStack_90 = 0x30;
  }
  else {
    if (lVar1 != LIBSSH2_EC_CURVE_NISTP256) {
      return -1;
    }
    _libssh2_sha256_init(&ctx);
    uVar3 = 0;
    uVar4 = (ulong)(uint)veccount;
    if (veccount < 1) {
      uVar4 = uVar3;
    }
    for (; uVar4 * 0x10 != uVar3; uVar3 = uVar3 + 0x10) {
      EVP_DigestUpdate((EVP_MD_CTX *)ctx,*(void **)((long)&datavec->iov_base + uVar3),
                       *(size_t *)((long)&datavec->iov_len + uVar3));
    }
    EVP_DigestFinal((EVP_MD_CTX *)ctx,hash,(uint *)0x0);
    EVP_MD_CTX_free(ctx);
    uStack_90 = 0x20;
  }
  iVar2 = _libssh2_ecdsa_sign(session,ec_ctx,hash,uStack_90,signature,local_80);
  return iVar2;
}

Assistant:

static int
hostkey_method_ssh_ecdsa_signv(LIBSSH2_SESSION * session,
                               unsigned char **signature,
                               size_t *signature_len,
                               int veccount,
                               const struct iovec datavec[],
                               void **abstract)
{
    libssh2_ecdsa_ctx *ec_ctx = (libssh2_ecdsa_ctx *) (*abstract);
    libssh2_curve_type type = _libssh2_ecdsa_get_curve_type(ec_ctx);
    int ret = 0;

    if(type == LIBSSH2_EC_CURVE_NISTP256) {
        LIBSSH2_HOSTKEY_METHOD_EC_SIGNV_HASH(256);
    }
    else if(type == LIBSSH2_EC_CURVE_NISTP384) {
        LIBSSH2_HOSTKEY_METHOD_EC_SIGNV_HASH(384);
    }
    else if(type == LIBSSH2_EC_CURVE_NISTP521) {
        LIBSSH2_HOSTKEY_METHOD_EC_SIGNV_HASH(512);
    }
    else {
        return -1;
    }

    return ret;
}